

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscretePure.cpp
# Opt level: O2

void __thiscall
JointPolicyDiscretePure::JointPolicyDiscretePure
          (JointPolicyDiscretePure *this,I_PtPDpure_constPtr *pu,PolicyDomainCategory idc)

{
  int *piVar1;
  sp_counted_base *psVar2;
  I_PtPD_constPtr local_28;
  
  local_28.px = &pu->px->super_Interface_ProblemToPolicyDiscrete;
  local_28.pn.pi_ = (pu->pn).pi_;
  psVar2 = (pu->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  JointPolicyDiscrete::JointPolicyDiscrete(&this->super_JointPolicyDiscrete,&local_28,idc);
  boost::detail::shared_count::~shared_count(&local_28.pn);
  (this->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy =
       (_func_int **)&PTR_operator__005e5aa8;
  return;
}

Assistant:

JointPolicyDiscretePure::JointPolicyDiscretePure(
        const I_PtPDpure_constPtr &pu,
        PolicyGlobals::PolicyDomainCategory idc ) :
    JointPolicyDiscrete( pu , idc )
{
    
}